

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::SerialArena
          (SerialArena *this,ArenaBlock *b,ThreadSafeArena *parent)

{
  size_t sVar1;
  char *pcVar2;
  LogMessageFatal LStack_28;
  
  pcVar2 = ArenaBlock::Pointer(b,0x88);
  (this->ptr_)._M_b._M_p = pcVar2;
  pcVar2 = ArenaBlock::Limit(b);
  this->limit_ = pcVar2;
  pcVar2 = ArenaBlock::Pointer(b,0x88);
  this->prefetch_ptr_ = pcVar2;
  (this->cleanup_list_).head_ = (Chunk *)0x0;
  (this->cleanup_list_).next_ = (CleanupNode *)0x0;
  (this->cleanup_list_).limit_ = (CleanupNode *)0x0;
  (this->cleanup_list_).prefetch_ptr_ = (char *)0x0;
  (this->string_block_)._M_b._M_p = (__pointer_type)0x0;
  (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->head_)._M_b._M_p = b;
  (this->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
  sVar1 = b->size;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = sVar1;
  this->parent_ = parent;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  if (sVar1 != 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0xcd,"!b->IsSentry()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

SerialArena::SerialArena(ArenaBlock* b, ThreadSafeArena& parent)
    : ptr_{b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize)},
      limit_{b->Limit()},
      prefetch_ptr_(
          b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize)),
      head_{b},
      space_allocated_{b->size},
      parent_{parent} {
  ABSL_DCHECK(!b->IsSentry());
}